

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *inc,_Bool newsession)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  CookieInfo *c;
  char *pcVar3;
  FILE *input;
  bool bVar4;
  undefined1 auVar5 [16];
  
  c = inc;
  if (inc == (CookieInfo *)0x0) {
    c = (CookieInfo *)(*Curl_ccalloc)(1,0x28);
    if (c != (CookieInfo *)0x0) {
      pcVar3 = "none";
      if (file != (char *)0x0) {
        pcVar3 = file;
      }
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      c->filename = pcVar3;
      if (pcVar3 != (char *)0x0) goto LAB_0010cfb7;
      __stream = (FILE *)0x0;
      (*Curl_cfree)((void *)0x0);
      bVar4 = true;
LAB_0010d11d:
      Curl_cookie_cleanup(c);
LAB_0010d125:
      if (__stream != (FILE *)0x0 && bVar4) {
        fclose(__stream);
      }
    }
    c = (CookieInfo *)0x0;
  }
  else {
LAB_0010cfb7:
    c->running = false;
    if ((file == (char *)0x0) || (*file == '\0')) {
      c->newsession = newsession;
    }
    else {
      if ((*file == '-') && (file[1] == '\0')) {
        bVar4 = false;
        __stream = _stdin;
      }
      else {
        __stream = fopen64(file,"r");
        bVar4 = true;
      }
      c->newsession = newsession;
      if (__stream != (FILE *)0x0) {
        auVar5 = (undefined1  [16])(*Curl_cmalloc)(5000);
        pcVar3 = auVar5._0_8_;
        if (pcVar3 == (char *)0x0) {
          (*Curl_cfree)((void *)0x0);
          if (inc == (CookieInfo *)0x0) goto LAB_0010d11d;
          goto LAB_0010d125;
        }
        pcVar2 = get_line(pcVar3,(int)__stream,auVar5._8_8_);
        if (pcVar2 != (char *)0x0) {
          do {
            iVar1 = curl_strnequal("Set-Cookie:",pcVar3,0xb);
            pcVar2 = pcVar3;
            if (iVar1 != 0) {
              pcVar2 = pcVar3 + 0xb;
            }
            for (; (*pcVar2 == ' ' || (*pcVar2 == '\t')); pcVar2 = pcVar2 + 1) {
            }
            Curl_cookie_add(data,c,iVar1 != 0,pcVar2,(char *)0x0,(char *)0x0);
            pcVar2 = get_line(pcVar3,(int)__stream,input);
          } while (pcVar2 != (char *)0x0);
        }
        (*Curl_cfree)(pcVar3);
        if (bVar4) {
          fclose(__stream);
        }
      }
    }
    c->running = true;
  }
  return c;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *fp = NULL;
  bool fromfile=TRUE;
  char *line = NULL;

  if(NULL == inc) {
    /* we didn't get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    c->filename = strdup(file?file:"none"); /* copy the name just in case */
    if(!c->filename)
      goto fail; /* failed to get memory */
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->running = FALSE; /* this is not running, this is init */

  if(file && !strcmp(file, "-")) {
    fp = stdin;
    fromfile=FALSE;
  }
  else if(file && !*file) {
    /* points to a "" string */
    fp = NULL;
  }
  else
    fp = file?fopen(file, FOPEN_READTEXT):NULL;

  c->newsession = newsession; /* new session? */

  if(fp) {
    char *lineptr;
    bool headerline;

    line = malloc(MAX_COOKIE_LINE);
    if(!line)
      goto fail;
    while(get_line(line, MAX_COOKIE_LINE, fp)) {
      if(checkprefix("Set-Cookie:", line)) {
        /* This is a cookie line, get it! */
        lineptr=&line[11];
        headerline=TRUE;
      }
      else {
        lineptr=line;
        headerline=FALSE;
      }
      while(*lineptr && ISBLANK(*lineptr))
        lineptr++;

      Curl_cookie_add(data, c, headerline, lineptr, NULL, NULL);
    }
    free(line); /* free the line buffer */

    if(fromfile)
      fclose(fp);
  }

  c->running = TRUE;          /* now, we're running */

  return c;

fail:
  free(line);
  if(!inc)
    /* Only clean up if we allocated it here, as the original could still be in
     * use by a share handle */
    Curl_cookie_cleanup(c);
  if(fromfile && fp)
    fclose(fp);
  return NULL; /* out of memory */
}